

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O3

char * __thiscall ArgParser::ArgIterator::getstr(ArgIterator *this)

{
  int iVar1;
  char *pcVar2;
  range_error *this_00;
  
  iVar1 = this->i;
  if (iVar1 == this->argc) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"arg out of range");
    goto LAB_00102ad3;
  }
  if ((this->isoption == true) && ((this->longmatch & 1U) == 0)) {
    pcVar2 = this->p;
    this->p = pcVar2 + 2;
    if (pcVar2[2] == '\0') {
LAB_00102a6e:
      this->i = iVar1 + 1;
      setcurrent(this);
    }
  }
  else if ((this->longmatch & 1U) != 0) {
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (this->p,this->pend);
    this->p = pcVar2;
    if (pcVar2 != this->pend) {
      return pcVar2 + 1;
    }
    iVar1 = this->i;
    if (iVar1 != this->argc) goto LAB_00102a6e;
  }
  if (this->i != this->argc) {
    return this->p;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"arg out of range");
LAB_00102ad3:
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

const char *getstr()
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            if (isoption && !longmatch) {
                // skips '-' + optionchar
                p += 2;
                if (*p==0) {
                    //  -opt <space> argument
                    operator++();
                }

                // -opt<argument>
            }
            else if (longmatch) {
                // long match need not match the full word.
                p = std::find(p, pend, '=');
                if (p!=pend) {
                    // --longopt '=' argument
                    return p+1;
                }

                // --longopt <space> argument
                operator++();
            }

            // check again if we are out of options
            if (i==argc)
                throw std::range_error("arg out of range");
            return p;
        }